

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O2

void __thiscall
tao::pegtl::internal::
memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
::memory_input_base<char_const(&)[6]>
          (memory_input_base<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,char *in_begin,char *in_end,char (*in_source) [6])

{
  allocator<char> local_1;
  
  *(char **)this = in_begin;
  *(char **)(this + 8) = in_begin;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 1;
  *(undefined8 *)(this + 0x20) = 0;
  *(char **)(this + 0x28) = in_end;
  std::__cxx11::string::string<std::allocator<char>>((string *)(this + 0x30),*in_source,&local_1);
  return;
}

Assistant:

memory_input_base( const char* in_begin, const char* in_end, T&& in_source ) noexcept( std::is_nothrow_constructible< Source, T&& >::value )
               : m_begin( in_begin ),
                 m_current( in_begin ),
                 m_end( in_end ),
                 m_source( std::forward< T >( in_source ) )
            {
            }